

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deferred_guarded.hpp
# Opt level: O0

void __thiscall gmlc::libguarded::void_runner<int>::run_task(void_runner<int> *this,int *obj)

{
  packaged_task<void_(int_&)> *this_00;
  handle local_30;
  int *local_18;
  int *obj_local;
  void_runner<int> *this_local;
  
  local_18 = obj;
  obj_local = (int *)this;
  guarded<std::packaged_task<void_(int_&)>,_std::mutex>::lock(&local_30,&this->task);
  this_00 = lock_handle<std::packaged_task<void_(int_&)>,_std::mutex>::operator->(&local_30);
  std::packaged_task<void_(int_&)>::operator()(this_00,local_18);
  lock_handle<std::packaged_task<void_(int_&)>,_std::mutex>::~lock_handle(&local_30);
  return;
}

Assistant:

virtual void run_task(T& obj) { task.lock()->operator()(obj); }